

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynarray.cpp
# Opt level: O3

void __thiscall DynArray::Add(DynArray *this,char *value)

{
  uint uVar1;
  char *__src;
  char *__dest;
  uint uVar2;
  
  uVar2 = this->length;
  __src = this->data;
  __dest = __src;
  if (uVar2 == this->data_size) {
    this->data_size = uVar2 * 2;
    uVar1 = this->elem_size;
    __dest = (char *)malloc((ulong)(uVar2 * 2 * uVar1));
    memcpy(__dest,__src,(ulong)(uVar1 * uVar2));
    free(__src);
    this->data = __dest;
    uVar2 = this->length;
  }
  memcpy(__dest + uVar2 * this->elem_size,value,(ulong)this->elem_size);
  this->length = this->length + 1;
  return;
}

Assistant:

void
DynArray::Add(char *value)
{
  if (length == data_size) {
    data_size *= 2;

    char *new_data;
    new_data = (char *)malloc(data_size * elem_size);
    memcpy(new_data, data, length * elem_size);
    free(data);
    data = new_data;
  }

  // copy the data to the array
  memcpy(&data[length * elem_size], value, elem_size);
  length++;
}